

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QVariant *
variantMapValueForKeyPath(QVariant *__return_storage_ptr__,QVariant *value,QStringList *keyPath)

{
  long lVar1;
  char cVar2;
  QArrayDataPointer<QString> local_50;
  QVariant firstValue;
  
  lVar1 = (keyPath->d).size;
  if (lVar1 < 2) {
    if (lVar1 == 0) {
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    }
    else {
      variantMapValue(__return_storage_ptr__,value,(keyPath->d).ptr);
    }
  }
  else {
    variantMapValue(&firstValue,value,(keyPath->d).ptr);
    cVar2 = QVariant::isNull();
    if (cVar2 == '\0') {
      QList<QString>::mid((QList<QString> *)&local_50,keyPath,1,-1);
      variantMapValueForKeyPath(__return_storage_ptr__,&firstValue,(QStringList *)&local_50);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
    }
    else {
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    }
    QVariant::~QVariant(&firstValue);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant variantMapValueForKeyPath(const QVariant& value, const QStringList keyPath)
{
	if (keyPath.count() > 1) {
		QVariant firstValue = variantMapValue(value, keyPath.first());
		return firstValue.isNull() ? QVariant() : variantMapValueForKeyPath(firstValue, keyPath.mid(1));
	} else if (!keyPath.isEmpty()) {
		return variantMapValue(value, keyPath.first());
	}
	return QVariant();
}